

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_basics<vector_brodnik<unsigned_long>>(void)

{
  ostream *this;
  size_t sVar1;
  unsigned_long uVar2;
  uint local_144;
  ulong uStack_140;
  uint i_6;
  uint local_138;
  uint local_134;
  uint i_5;
  uint i_4;
  uint local_128;
  uint local_124;
  uint i_3;
  uint i_2;
  uint local_118;
  undefined4 local_114;
  uint i_1;
  uint N_1;
  vector_brodnik<unsigned_long> v_3;
  uint local_d0;
  uint i;
  uint N;
  vector_brodnik<unsigned_long> v_2;
  undefined1 local_88 [8];
  vector_brodnik<unsigned_long> v_1;
  undefined1 local_40 [8];
  vector_brodnik<unsigned_long> v;
  
  this = std::operator<<((ostream *)&std::cerr,
                         "void test_basics() [Container = vector_brodnik<unsigned long>]");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  vector_brodnik<unsigned_long>::vector_brodnik((vector_brodnik<unsigned_long> *)local_40);
  sVar1 = vector_brodnik<unsigned_long>::size((vector_brodnik<unsigned_long> *)local_40);
  if (sVar1 != 0) {
    __assert_fail("v.size()==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                  ,0x1f,"void test_basics() [Container = vector_brodnik<unsigned long>]");
  }
  vector_brodnik<unsigned_long>::~vector_brodnik((vector_brodnik<unsigned_long> *)local_40);
  vector_brodnik<unsigned_long>::vector_brodnik((vector_brodnik<unsigned_long> *)local_88);
  v_2._left_in_superblock = 1;
  v_2._superblock_size = 0;
  v_2._superblock = '\0';
  v_2._53_3_ = 0;
  vector_brodnik<unsigned_long>::push_back
            ((vector_brodnik<unsigned_long> *)local_88,(unsigned_long *)&v_2._left_in_superblock);
  sVar1 = vector_brodnik<unsigned_long>::size((vector_brodnik<unsigned_long> *)local_88);
  if (sVar1 == 1) {
    uVar2 = vector_brodnik<unsigned_long>::operator[]((vector_brodnik<unsigned_long> *)local_88,0);
    if (uVar2 != 1) {
      __assert_fail("v[0]==1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                    ,0x25,"void test_basics() [Container = vector_brodnik<unsigned long>]");
    }
    vector_brodnik<unsigned_long>::~vector_brodnik((vector_brodnik<unsigned_long> *)local_88);
    vector_brodnik<unsigned_long>::vector_brodnik((vector_brodnik<unsigned_long> *)&i);
    local_d0 = 0;
    while( true ) {
      if (999999 < local_d0) {
        sVar1 = vector_brodnik<unsigned_long>::size((vector_brodnik<unsigned_long> *)&i);
        if (sVar1 != 1000000) {
          __assert_fail("v.size()==N",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                        ,0x2f,"void test_basics() [Container = vector_brodnik<unsigned long>]");
        }
        vector_brodnik<unsigned_long>::~vector_brodnik((vector_brodnik<unsigned_long> *)&i);
        vector_brodnik<unsigned_long>::vector_brodnik((vector_brodnik<unsigned_long> *)&i_1);
        local_114 = 1000000;
        for (local_118 = 0; local_118 < 1000000; local_118 = local_118 + 1) {
          _i_3 = (ulong)local_118;
          vector_brodnik<unsigned_long>::push_back
                    ((vector_brodnik<unsigned_long> *)&i_1,(unsigned_long *)&i_3);
        }
        local_124 = 0;
        while( true ) {
          if (999999 < local_124) {
            vector_brodnik<unsigned_long>::clear((vector_brodnik<unsigned_long> *)&i_1);
            sVar1 = vector_brodnik<unsigned_long>::size((vector_brodnik<unsigned_long> *)&i_1);
            if (sVar1 != 0) {
              __assert_fail("v.size()==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                            ,0x37,"void test_basics() [Container = vector_brodnik<unsigned long>]");
            }
            for (local_128 = 0; local_128 < 1000000; local_128 = local_128 + 1) {
              _i_5 = (ulong)local_128;
              vector_brodnik<unsigned_long>::push_back
                        ((vector_brodnik<unsigned_long> *)&i_1,(unsigned_long *)&i_5);
            }
            local_134 = 0;
            while( true ) {
              if (999999 < local_134) {
                vector_brodnik<unsigned_long>::clear((vector_brodnik<unsigned_long> *)&i_1);
                sVar1 = vector_brodnik<unsigned_long>::size((vector_brodnik<unsigned_long> *)&i_1);
                if (sVar1 != 0) {
                  __assert_fail("v.size()==0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                                ,0x3b,
                                "void test_basics() [Container = vector_brodnik<unsigned long>]");
                }
                for (local_138 = 0; local_138 < 1000000; local_138 = local_138 + 1) {
                  uStack_140 = (ulong)local_138;
                  vector_brodnik<unsigned_long>::push_back
                            ((vector_brodnik<unsigned_long> *)&i_1,&stack0xfffffffffffffec0);
                }
                local_144 = 0;
                while( true ) {
                  if (999999 < local_144) {
                    vector_brodnik<unsigned_long>::clear((vector_brodnik<unsigned_long> *)&i_1);
                    sVar1 = vector_brodnik<unsigned_long>::size
                                      ((vector_brodnik<unsigned_long> *)&i_1);
                    if (sVar1 == 0) {
                      vector_brodnik<unsigned_long>::~vector_brodnik
                                ((vector_brodnik<unsigned_long> *)&i_1);
                      return;
                    }
                    __assert_fail("v.size()==0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                                  ,0x3f,
                                  "void test_basics() [Container = vector_brodnik<unsigned long>]");
                  }
                  uVar2 = vector_brodnik<unsigned_long>::operator[]
                                    ((vector_brodnik<unsigned_long> *)&i_1,(ulong)local_144);
                  if ((uint)uVar2 != local_144) break;
                  local_144 = local_144 + 1;
                }
                __assert_fail("unsigned(v[i])==i",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                              ,0x3d,"void test_basics() [Container = vector_brodnik<unsigned long>]"
                             );
              }
              uVar2 = vector_brodnik<unsigned_long>::operator[]
                                ((vector_brodnik<unsigned_long> *)&i_1,(ulong)local_134);
              if ((uint)uVar2 != local_134) break;
              local_134 = local_134 + 1;
            }
            __assert_fail("unsigned(v[i])==i",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                          ,0x39,"void test_basics() [Container = vector_brodnik<unsigned long>]");
          }
          uVar2 = vector_brodnik<unsigned_long>::operator[]
                            ((vector_brodnik<unsigned_long> *)&i_1,(ulong)local_124);
          if ((uint)uVar2 != local_124) break;
          local_124 = local_124 + 1;
        }
        __assert_fail("unsigned(v[i])==i",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                      ,0x35,"void test_basics() [Container = vector_brodnik<unsigned long>]");
      }
      sVar1 = vector_brodnik<unsigned_long>::size((vector_brodnik<unsigned_long> *)&i);
      if (sVar1 != local_d0) break;
      v_3._48_8_ = ZEXT48(local_d0);
      vector_brodnik<unsigned_long>::push_back
                ((vector_brodnik<unsigned_long> *)&i,(unsigned_long *)&v_3._left_in_superblock);
      uVar2 = vector_brodnik<unsigned_long>::operator[]
                        ((vector_brodnik<unsigned_long> *)&i,(ulong)local_d0);
      if ((uint)uVar2 != local_d0) {
        __assert_fail("unsigned(v[i])==i",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                      ,0x2d,"void test_basics() [Container = vector_brodnik<unsigned long>]");
      }
      local_d0 = local_d0 + 1;
    }
    __assert_fail("v.size()==i",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                  ,0x2b,"void test_basics() [Container = vector_brodnik<unsigned long>]");
  }
  __assert_fail("v.size()==1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                ,0x24,"void test_basics() [Container = vector_brodnik<unsigned long>]");
}

Assistant:

void test_basics()
{
	std::cerr<<__PRETTY_FUNCTION__<<std::endl;
	{
		Container v;
		assert(v.size()==0);
	}
	{
		Container v;
		v.push_back(1);
		assert(v.size()==1);
		assert(v[0]==1);
	}
	{
		Container v;
		const unsigned N=1000000;
		for (unsigned i=0; i < N; ++i) {
			assert(v.size()==i);
			v.push_back(i);
			assert(unsigned(v[i])==i);
		}
		assert(v.size()==N);
	}
	{
		Container v;
		const unsigned N=1000000;
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
	}
}